

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O1

SRes LzmaDec_DecodeToBuf(CLzmaDec *p,Byte *dest,SizeT *destLen,Byte *src,SizeT *srcLen,
                        ELzmaFinishMode finishMode,ELzmaStatus *status)

{
  SizeT SVar1;
  SizeT SVar2;
  ELzmaFinishMode finishMode_00;
  Byte *pBVar3;
  SRes SVar4;
  SRes unaff_EBX;
  SizeT SVar5;
  SizeT dicLimit;
  size_t __n;
  SizeT inSizeCur;
  SizeT local_60;
  SizeT *local_58;
  SizeT *local_50;
  SizeT local_48;
  Byte *local_40;
  Byte *local_38;
  
  SVar5 = *destLen;
  local_60 = *srcLen;
  *destLen = 0;
  *srcLen = 0;
  local_58 = destLen;
  local_50 = srcLen;
  while( true ) {
    SVar1 = p->dicBufSize;
    if (p->dicPos == SVar1) {
      p->dicPos = 0;
    }
    SVar2 = p->dicPos;
    dicLimit = SVar2 + SVar5;
    if (SVar1 - SVar2 < SVar5) {
      dicLimit = SVar1;
    }
    finishMode_00 = finishMode;
    if (SVar1 - SVar2 < SVar5) {
      finishMode_00 = LZMA_FINISH_ANY;
    }
    local_48 = local_60;
    local_40 = dest;
    local_38 = src;
    SVar4 = LzmaDec_DecodeToDic(p,dicLimit,src,&local_60,finishMode_00,status);
    pBVar3 = local_40;
    SVar1 = local_60;
    *local_50 = *local_50 + local_60;
    __n = p->dicPos - SVar2;
    memcpy(local_40,p->dic + SVar2,__n);
    *local_58 = *local_58 + __n;
    SVar5 = SVar5 - __n;
    if (SVar5 == 0 || __n == 0) {
      unaff_EBX = 0;
    }
    if (SVar4 != 0) break;
    src = local_38 + SVar1;
    local_60 = local_48 - SVar1;
    dest = pBVar3 + __n;
    if (SVar5 == 0 || __n == 0) {
      return unaff_EBX;
    }
  }
  return SVar4;
}

Assistant:

SRes LzmaDec_DecodeToBuf(CLzmaDec *p, Byte *dest, SizeT *destLen, const Byte *src, SizeT *srcLen, ELzmaFinishMode finishMode, ELzmaStatus *status)
{
  SizeT outSize = *destLen;
  SizeT inSize = *srcLen;
  *srcLen = *destLen = 0;
  for (;;)
  {
    SizeT inSizeCur = inSize, outSizeCur, dicPos;
    ELzmaFinishMode curFinishMode;
    SRes res;
    if (p->dicPos == p->dicBufSize)
      p->dicPos = 0;
    dicPos = p->dicPos;
    if (outSize > p->dicBufSize - dicPos)
    {
      outSizeCur = p->dicBufSize;
      curFinishMode = LZMA_FINISH_ANY;
    }
    else
    {
      outSizeCur = dicPos + outSize;
      curFinishMode = finishMode;
    }

    res = LzmaDec_DecodeToDic(p, outSizeCur, src, &inSizeCur, curFinishMode, status);
    src += inSizeCur;
    inSize -= inSizeCur;
    *srcLen += inSizeCur;
    outSizeCur = p->dicPos - dicPos;
    memcpy(dest, p->dic + dicPos, outSizeCur);
    dest += outSizeCur;
    outSize -= outSizeCur;
    *destLen += outSizeCur;
    if (res != 0)
      return res;
    if (outSizeCur == 0 || outSize == 0)
      return SZ_OK;
  }
}